

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O3

uchar __thiscall xercesc_4_0::XPathMatcher::isMatched(XPathMatcher *this)

{
  byte bVar1;
  XMLSize_t XVar2;
  
  if (this->fLocationPathSize != 0) {
    XVar2 = 0;
    do {
      bVar1 = this->fMatched[XVar2];
      if ((~bVar1 & 0xd) != 0 && (bVar1 & 1) != 0) {
        return bVar1;
      }
      XVar2 = XVar2 + 1;
    } while (this->fLocationPathSize != XVar2);
  }
  return '\0';
}

Assistant:

unsigned char XPathMatcher::isMatched() {

    // xpath has been matched if any one of the members of the union have matched.
    for (XMLSize_t i=0; i < fLocationPathSize; i++) {
        if (((fMatched[i] & XP_MATCHED) == XP_MATCHED)
            && ((fMatched[i] & XP_MATCHED_DP) != XP_MATCHED_DP))
            return fMatched[i];
    }

    return 0;
}